

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O1

void av1_svc_check_reset_layer_rc_flag(AV1_COMP *cpi)

{
  uint uVar1;
  LAYER_CONTEXT *pLVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  
  lVar4 = (long)(cpi->svc).number_spatial_layers;
  if (0 < lVar4) {
    uVar1 = (cpi->svc).number_temporal_layers;
    pLVar2 = (cpi->svc).layer_context;
    lVar8 = (long)(int)uVar1;
    uVar9 = 0;
    lVar10 = 0;
    do {
      lVar6 = lVar10 * lVar8;
      iVar7 = pLVar2[lVar8 + lVar6 + -1].rc.avg_frame_bandwidth;
      iVar5 = pLVar2[lVar8 + lVar6 + -1].rc.prev_avg_frame_bandwidth;
      if (iVar5 == 0 || iVar7 == 0) {
        iVar7 = pLVar2[lVar6].rc.avg_frame_bandwidth;
        iVar5 = pLVar2[lVar6].rc.prev_avg_frame_bandwidth;
      }
      if ((iVar7 < iVar5 >> 1 || iVar5 >> 1 < iVar7 / 3) && 0 < (int)uVar1) {
        lVar6 = 0;
        do {
          *(undefined8 *)
           ((long)pLVar2[uVar9].rc.frame_level_rate_correction_factors + lVar6 + -0x44) = 0;
          uVar3 = *(undefined8 *)((long)pLVar2[uVar9].p_rc.avg_frame_qindex + lVar6 + -0x44);
          *(undefined8 *)((long)pLVar2[uVar9].p_rc.q_history + lVar6 + -0x10) = uVar3;
          *(undefined8 *)((long)pLVar2[uVar9].p_rc.rate_correction_factors + lVar6 + 0x30) = uVar3;
          lVar6 = lVar6 + 0x3380;
        } while ((ulong)uVar1 * 0x3380 - lVar6 != 0);
      }
      lVar10 = lVar10 + 1;
      uVar9 = (ulong)((int)uVar9 + uVar1);
    } while (lVar10 != lVar4);
  }
  return;
}

Assistant:

void av1_svc_check_reset_layer_rc_flag(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
    // Check for reset based on avg_frame_bandwidth for spatial layer sl.
    // If avg_frame_bandwidth for top temporal layer is not set
    // (because enhancement layer was inactive), use the base TL0
    int layer = LAYER_IDS_TO_IDX(sl, svc->number_temporal_layers - 1,
                                 svc->number_temporal_layers);
    LAYER_CONTEXT *lc = &svc->layer_context[layer];
    RATE_CONTROL *lrc = &lc->rc;
    int avg_frame_bandwidth = lrc->avg_frame_bandwidth;
    int prev_avg_frame_bandwidth = lrc->prev_avg_frame_bandwidth;
    if (avg_frame_bandwidth == 0 || prev_avg_frame_bandwidth == 0) {
      // Use base TL0.
      layer = LAYER_IDS_TO_IDX(sl, 0, svc->number_temporal_layers);
      lc = &svc->layer_context[layer];
      lrc = &lc->rc;
      avg_frame_bandwidth = lrc->avg_frame_bandwidth;
      prev_avg_frame_bandwidth = lrc->prev_avg_frame_bandwidth;
    }
    if (avg_frame_bandwidth / 3 > (prev_avg_frame_bandwidth >> 1) ||
        avg_frame_bandwidth < (prev_avg_frame_bandwidth >> 1)) {
      // Reset for all temporal layers with spatial layer sl.
      for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
        int layer2 = LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
        LAYER_CONTEXT *lc2 = &svc->layer_context[layer2];
        RATE_CONTROL *lrc2 = &lc2->rc;
        PRIMARY_RATE_CONTROL *lp_rc2 = &lc2->p_rc;
        PRIMARY_RATE_CONTROL *const lp_rc = &lc2->p_rc;
        lrc2->rc_1_frame = 0;
        lrc2->rc_2_frame = 0;
        lp_rc2->bits_off_target = lp_rc->optimal_buffer_level;
        lp_rc2->buffer_level = lp_rc->optimal_buffer_level;
      }
    }
  }
}